

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O0

void __thiscall
NshHistoryAddEntry_SuccessTwoElement_Test::~NshHistoryAddEntry_SuccessTwoElement_Test
          (NshHistoryAddEntry_SuccessTwoElement_Test *this)

{
  NshHistoryAddEntry_SuccessTwoElement_Test *this_local;
  
  ~NshHistoryAddEntry_SuccessTwoElement_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshHistoryAddEntry, SuccessTwoElement)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry1[] = "new_entry1";
    const char new_entry2[] = "new_entry2";
    nsh_history_add_entry(&hist, new_entry1);
    nsh_history_add_entry(&hist, new_entry2);

    ASSERT_EQ(hist.size, 2);
    ASSERT_EQ(hist.head, 2);
    ASSERT_EQ(hist.tail, 0);
    ASSERT_STREQ(hist.entries[0], new_entry1);
    ASSERT_STREQ(hist.entries[1], new_entry2);
}